

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O0

RK_U32 to_rockchip_gem_mem_flag(RK_U32 flags)

{
  undefined4 local_10;
  RK_U32 ret;
  RK_U32 flags_local;
  
  local_10 = 0;
  if ((flags & 1) != 0) {
    local_10 = 0x20;
  }
  if ((flags & 2) != 0) {
    local_10 = local_10 | 2;
  }
  if ((flags & 4) != 0) {
    local_10 = local_10 | 1;
  }
  return local_10;
}

Assistant:

static RK_U32 to_rockchip_gem_mem_flag(RK_U32 flags)
{
    RK_U32 ret = 0;

    if (flags & MPP_ALLOC_FLAG_DMA32)
        ret |= ROCKCHIP_BO_DMA32;

    if (flags & MPP_ALLOC_FLAG_CACHABLE)
        ret |= ROCKCHIP_BO_CACHABLE;

    if (flags & MPP_ALLOC_FLAG_CMA)
        ret |= ROCKCHIP_BO_CONTIG;

    return ret;
}